

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ref.c
# Opt level: O1

int run_test_check_ref(void)

{
  uint uVar1;
  int iVar2;
  uv_loop_t *puVar3;
  uv_loop_t *puVar4;
  ulong uVar5;
  undefined8 in_R9;
  uv_check_t h;
  uv_timer_t uStack_260;
  uv_loop_t *puStack_1c8;
  uv_timer_t uStack_1b8;
  uv_loop_t *puStack_120;
  code *pcStack_118;
  uv_prepare_t uStack_108;
  uv_loop_t *puStack_90;
  uv_check_t local_80;
  
  puStack_90 = (uv_loop_t *)0x166a0d;
  puVar3 = uv_default_loop();
  puStack_90 = (uv_loop_t *)0x166a1d;
  uv_check_init(puVar3,&local_80);
  puStack_90 = (uv_loop_t *)0x166a2c;
  uv_check_start(&local_80,fail_cb2);
  puStack_90 = (uv_loop_t *)0x166a34;
  uv_unref((uv_handle_t *)&local_80);
  puStack_90 = (uv_loop_t *)0x166a39;
  puVar3 = uv_default_loop();
  puStack_90 = (uv_loop_t *)0x166a43;
  uv_run(puVar3,UV_RUN_DEFAULT);
  puStack_90 = (uv_loop_t *)0x166a4b;
  do_close(&local_80);
  puStack_90 = (uv_loop_t *)0x166a50;
  puVar3 = uv_default_loop();
  puStack_90 = (uv_loop_t *)0x166a64;
  uv_walk(puVar3,close_walk_cb,(void *)0x0);
  puStack_90 = (uv_loop_t *)0x166a6e;
  uv_run(puVar3,UV_RUN_DEFAULT);
  puStack_90 = (uv_loop_t *)0x166a73;
  puVar4 = uv_default_loop();
  puStack_90 = (uv_loop_t *)0x166a7b;
  iVar2 = uv_loop_close(puVar4);
  if (iVar2 == 0) {
    return 0;
  }
  puStack_90 = (uv_loop_t *)run_test_unref_in_prepare_cb;
  run_test_check_ref_cold_1();
  pcStack_118 = (code *)0x166a9c;
  puStack_90 = puVar3;
  puVar3 = uv_default_loop();
  pcStack_118 = (code *)0x166aac;
  uv_prepare_init(puVar3,&uStack_108);
  pcStack_118 = (code *)0x166abb;
  uv_prepare_start(&uStack_108,prepare_cb);
  pcStack_118 = (code *)0x166ac0;
  puVar3 = uv_default_loop();
  pcStack_118 = (code *)0x166aca;
  uv_run(puVar3,UV_RUN_DEFAULT);
  pcStack_118 = (code *)0x166ad2;
  do_close(&uStack_108);
  pcStack_118 = (code *)0x166ad7;
  puVar3 = uv_default_loop();
  pcStack_118 = (code *)0x166aeb;
  uv_walk(puVar3,close_walk_cb,(void *)0x0);
  pcStack_118 = (code *)0x166af5;
  uv_run(puVar3,UV_RUN_DEFAULT);
  pcStack_118 = (code *)0x166afa;
  puVar4 = uv_default_loop();
  pcStack_118 = (code *)0x166b02;
  iVar2 = uv_loop_close(puVar4);
  if (iVar2 == 0) {
    return 0;
  }
  pcStack_118 = prepare_cb;
  run_test_unref_in_prepare_cb_cold_1();
  if (puVar4 != (uv_loop_t *)0x0) {
    uVar1 = *(uint *)puVar4->watcher_queue;
    uVar5 = (ulong)uVar1;
    if ((uVar1 & 8) != 0) {
      *(uint *)puVar4->watcher_queue = uVar1 & 0xfffffff7;
      uVar5 = (ulong)(uVar1 & 5);
      if ((uVar1 & 5) == 4) {
        uVar5 = *(ulong *)&puVar4->active_handles;
        *(int *)(uVar5 + 8) = *(int *)(uVar5 + 8) + -1;
      }
    }
    return (int)uVar5;
  }
  puStack_120 = (uv_loop_t *)run_test_timer_ref;
  prepare_cb_cold_1();
  puStack_1c8 = (uv_loop_t *)0x166b32;
  puStack_120 = puVar3;
  puVar3 = uv_default_loop();
  puStack_1c8 = (uv_loop_t *)0x166b42;
  uv_timer_init(puVar3,&uStack_1b8);
  puStack_1c8 = (uv_loop_t *)0x166b4a;
  uv_unref((uv_handle_t *)&uStack_1b8);
  puStack_1c8 = (uv_loop_t *)0x166b4f;
  puVar3 = uv_default_loop();
  puStack_1c8 = (uv_loop_t *)0x166b59;
  uv_run(puVar3,UV_RUN_DEFAULT);
  puStack_1c8 = (uv_loop_t *)0x166b61;
  do_close(&uStack_1b8);
  puStack_1c8 = (uv_loop_t *)0x166b66;
  puVar3 = uv_default_loop();
  puStack_1c8 = (uv_loop_t *)0x166b7a;
  uv_walk(puVar3,close_walk_cb,(void *)0x0);
  puStack_1c8 = (uv_loop_t *)0x166b84;
  uv_run(puVar3,UV_RUN_DEFAULT);
  puStack_1c8 = (uv_loop_t *)0x166b89;
  puVar4 = uv_default_loop();
  puStack_1c8 = (uv_loop_t *)0x166b91;
  iVar2 = uv_loop_close(puVar4);
  if (iVar2 == 0) {
    return 0;
  }
  puStack_1c8 = (uv_loop_t *)run_test_timer_ref2;
  run_test_timer_ref_cold_1();
  puStack_1c8 = puVar3;
  puVar3 = uv_default_loop();
  uv_timer_init(puVar3,&uStack_260);
  uv_timer_start(&uStack_260,fail_cb,0x2a,0x2a);
  uv_unref((uv_handle_t *)&uStack_260);
  puVar3 = uv_default_loop();
  uv_run(puVar3,UV_RUN_DEFAULT);
  do_close(&uStack_260);
  puVar3 = uv_default_loop();
  uv_walk(puVar3,close_walk_cb,(void *)0x0);
  uv_run(puVar3,UV_RUN_DEFAULT);
  puVar4 = uv_default_loop();
  iVar2 = uv_loop_close(puVar4);
  if (iVar2 == 0) {
    return 0;
  }
  run_test_timer_ref2_cold_1();
  fprintf(_stderr,"Fatal error in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ref.c"
          ,0x39,"fail_cb should not have been called",in_R9,puVar3);
  fflush(_stderr);
  abort();
}

Assistant:

TEST_IMPL(check_ref) {
  uv_check_t h;
  uv_check_init(uv_default_loop(), &h);
  uv_check_start(&h, (uv_check_cb) fail_cb2);
  uv_unref((uv_handle_t*)&h);
  uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  do_close(&h);
  MAKE_VALGRIND_HAPPY();
  return 0;
}